

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_LTX_select_free(CMtrans_services_conflict svc,CManager cm,void *client_data)

{
  select_data_ptr *in_RDX;
  CMtrans_services_conflict in_RSI;
  long in_RDI;
  select_data_ptr sd;
  select_data_ptr *sdp;
  
  (**(code **)(in_RDI + 0x38))((*in_RDX)->cm,7,"CMSelect free task called");
  if (*in_RDX != (select_data_ptr)0x0) {
    free_epoll_data(in_RSI,in_RDX);
  }
  return;
}

Assistant:

extern void
libcmepoll_LTX_select_free(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMFreeVerbose, "CMSelect free task called");

    if (*((select_data_ptr *)client_data) != NULL) {
	free_epoll_data(svc, sdp);
    }
}